

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ListBox(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter
                   ,void *data,int items_count,int height_in_items)

{
  int iVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  char *item_text;
  ImGuiListClipper clipper;
  ImVec2 size;
  char *local_70;
  ImGuiListClipper local_64;
  ImGuiContext *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  iVar5 = 7;
  if (items_count < 7) {
    iVar5 = items_count;
  }
  if (-1 < height_in_items) {
    iVar5 = height_in_items;
  }
  fVar6 = GetTextLineHeightWithSpacing();
  local_48 = pIVar2;
  fVar7 = (pIVar2->Style).FramePadding.y;
  local_38.y = (float)(int)(fVar6 * ((float)iVar5 + 0.25) + fVar7 + fVar7);
  local_38.x = 0.0;
  bVar3 = BeginListBox(label,&local_38);
  if (bVar3) {
    ImGuiListClipper::ImGuiListClipper(&local_64);
    fVar7 = GetTextLineHeightWithSpacing();
    ImGuiListClipper::Begin(&local_64,items_count,fVar7);
    bVar3 = false;
    while (bVar4 = ImGuiListClipper::Step(&local_64), iVar5 = local_64.DisplayStart, bVar4) {
      for (; iVar5 < local_64.DisplayEnd; iVar5 = iVar5 + 1) {
        bVar4 = (*items_getter)(data,iVar5,&local_70);
        if (!bVar4) {
          local_70 = "*Unknown item*";
        }
        PushID(iVar5);
        iVar1 = *current_item;
        local_40.x = 0.0;
        local_40.y = 0.0;
        bVar4 = Selectable(local_70,iVar5 == iVar1,0,&local_40);
        if (bVar4) {
          *current_item = iVar5;
          bVar3 = true;
        }
        if (iVar5 == iVar1) {
          SetItemDefaultFocus();
        }
        PopID();
      }
    }
    EndChildFrame();
    EndGroup();
    if (bVar3 != false) {
      MarkItemEdited((local_48->CurrentWindow->DC).LastItemId);
    }
    ImGuiListClipper::~ImGuiListClipper(&local_64);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ListBox(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int height_in_items)
{
    ImGuiContext& g = *GImGui;

    // Calculate size from "height_in_items"
    if (height_in_items < 0)
        height_in_items = ImMin(items_count, 7);
    float height_in_items_f = height_in_items + 0.25f;
    ImVec2 size(0.0f, ImFloor(GetTextLineHeightWithSpacing() * height_in_items_f + g.Style.FramePadding.y * 2.0f));

    if (!BeginListBox(label, size))
        return false;

    // Assume all items have even height (= 1 line of text). If you need items of different height,
    // you can create a custom version of ListBox() in your code without using the clipper.
    bool value_changed = false;
    ImGuiListClipper clipper;
    clipper.Begin(items_count, GetTextLineHeightWithSpacing()); // We know exactly our line height here so we pass it as a minor optimization, but generally you don't need to.
    while (clipper.Step())
        for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
        {
            const char* item_text;
            if (!items_getter(data, i, &item_text))
                item_text = "*Unknown item*";

            PushID(i);
            const bool item_selected = (i == *current_item);
            if (Selectable(item_text, item_selected))
            {
                *current_item = i;
                value_changed = true;
            }
            if (item_selected)
                SetItemDefaultFocus();
            PopID();
        }
    EndListBox();
    if (value_changed)
        MarkItemEdited(g.CurrentWindow->DC.LastItemId);

    return value_changed;
}